

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

base_learner * ect_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  vw *pvVar2;
  options_i *options_00;
  int iVar3;
  ect *e;
  option_group_definition *poVar4;
  typed_option<unsigned_long> *op;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *op_00;
  size_t ws;
  base_learner *l;
  single_learner *base;
  learner<ect,_example> *plVar5;
  long lVar6;
  undefined **ppuVar7;
  label_parser *plVar8;
  byte bVar9;
  size_type __dnew_3;
  string link;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_1;
  _func_int ***local_380;
  _func_int **local_378;
  _func_int **local_370 [2];
  vw *local_360;
  options_i *local_358;
  long local_350;
  _func_int ***local_348;
  _func_int **local_340;
  _func_int **local_338 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  string local_2e8;
  option_group_definition local_2c8;
  long *local_290;
  long local_288;
  long local_280 [2];
  _func_int ***local_270;
  _func_int **local_268;
  _func_int **local_260 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar9 = 0;
  e = calloc_or_throw<ect>(1);
  memset(e,0,0xe8);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_210._0_8_ = (_func_int **)0x23;
  local_380 = local_370;
  local_380 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_380,(ulong)local_210);
  local_370[0] = (_func_int **)local_210._0_8_;
  local_380[2] = (_func_int **)0x6d616e72756f5420;
  local_380[3] = (_func_int **)0x6974704f20746e65;
  *(undefined4 *)local_380 = 0x6f727245;
  builtin_strncpy((char *)((long)local_380 + 4),"r Co",4);
  *(undefined4 *)(local_380 + 1) = 0x63657272;
  builtin_strncpy((char *)((long)local_380 + 0xc),"ting",4);
  builtin_strncpy((char *)((long)local_380 + 0x1f),"ions",4);
  local_378 = (_func_int **)local_210._0_8_;
  *(char *)((long)local_380 + local_210._0_8_) = '\0';
  local_2c8.m_name._M_dataplus._M_p = (pointer)&local_2c8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_380,(char *)(local_210._0_8_ + (long)local_380));
  local_2c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8.field_2._M_allocated_capacity._0_4_ = 0x746365;
  local_2e8._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_210,&local_2e8,&e->k);
  local_1a0 = true;
  local_348 = local_338;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x2b;
  local_348 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)&local_d0);
  local_338[0] = local_d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_348 + 0x1b)," with <k",8);
  builtin_strncpy((char *)((long)local_348 + 0x23),"> labels",8);
  local_348[2] = (_func_int **)0x6d616e72756f7420;
  local_348[3] = (_func_int **)0x6874697720746e65;
  *local_348 = (_func_int **)0x6f6320726f727245;
  local_348[1] = (_func_int **)0x676e697463657272;
  local_340 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_348 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (&local_2c8,(typed_option<unsigned_long> *)local_210);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_308.field_2._M_allocated_capacity._0_4_ = 0x6f727265;
  local_308.field_2._M_allocated_capacity._4_2_ = 0x72;
  local_308._M_string_length = 5;
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,&local_308,&e->errors);
  local_d0.super_base_option.m_keep = true;
  local_358 = options;
  op = VW::config::typed_option<unsigned_long>::default_value(&local_d0,0);
  local_170.super_base_option._vptr_base_option = (_func_int **)0x15;
  local_270 = local_260;
  local_270 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_170);
  local_260[0] = local_170.super_base_option._vptr_base_option;
  *local_270 = (_func_int **)0x612073726f727265;
  local_270[1] = (_func_int **)0x62206465776f6c6c;
  builtin_strncpy((char *)((long)local_270 + 0xd),"d by ECT",8);
  local_268 = local_170.super_base_option._vptr_base_option;
  *(char *)((long)local_270 + (long)local_170.super_base_option._vptr_base_option) = '\0';
  local_360 = all;
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,op);
  local_230.field_2._M_allocated_capacity._0_4_ = 0x6b6e696c;
  local_230._M_string_length = 4;
  local_230.field_2._M_local_buf[4] = '\0';
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,&local_230,&local_328);
  local_250.field_2._M_allocated_capacity = 0x797469746e656469;
  local_250._M_string_length = 8;
  local_250.field_2._M_local_buf[8] = '\0';
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  op_00 = VW::config::
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::default_value(&local_170,&local_250);
  (op_00->super_base_option).m_keep = true;
  local_350 = 0x3e;
  local_290 = local_280;
  local_290 = (long *)std::__cxx11::string::_M_create((ulong *)&local_290,(ulong)&local_350);
  local_280[0] = local_350;
  builtin_strncpy((char *)((long)local_290 + 0x2e)," glf1 or",8);
  builtin_strncpy((char *)((long)local_290 + 0x36)," poisson",8);
  local_290[4] = 0x676f6c202c797469;
  local_290[5] = 0x67202c6369747369;
  local_290[2] = 0x6f6974636e756620;
  local_290[3] = 0x746e656469203a6e;
  *local_290 = 0x2079666963657053;
  local_290[1] = 0x6b6e696c20656874;
  local_288 = local_350;
  *(char *)((long)local_290 + local_350) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar4,op_00);
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d8568;
  if (local_170.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  options_00 = local_358;
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d85d8;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  local_210._0_8_ = &PTR__typed_option_002d85d8;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_2c8);
  local_210._16_4_ = 0x746365;
  local_210._8_8_ = (pointer)0x3;
  local_210._0_8_ = local_210 + 0x10;
  iVar3 = (*options_00->_vptr_options_i[1])(options_00,local_210);
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_);
  }
  if ((char)iVar3 == '\0') {
    plVar5 = (learner<ect,_example> *)0x0;
  }
  else {
    ws = create_circuit(e,e->k,e->errors + 1);
    pvVar2 = local_360;
    l = setup_base(options_00,local_360);
    iVar3 = std::__cxx11::string::compare((char *)&local_328);
    if (iVar3 == 0) {
      e->class_boundary = 0.5;
    }
    base = LEARNER::as_singleline<char,char>(l);
    ppVar1 = pvVar2->p;
    plVar5 = LEARNER::learner<ect,example>::init_learner<LEARNER::learner<char,example>>
                       (e,base,learn,predict,ws,multiclass);
    *(undefined8 *)(plVar5 + 0x58) = *(undefined8 *)(plVar5 + 0x18);
    *(code **)(plVar5 + 0x68) = MULTICLASS::finish_example<ect>;
    ppuVar7 = &MULTICLASS::mc_label;
    plVar8 = &ppVar1->lp;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      plVar8->default_label = (_func_void_void_ptr *)*ppuVar7;
      ppuVar7 = ppuVar7 + (ulong)bVar9 * -2 + 1;
      plVar8 = (label_parser *)((long)plVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    *(undefined8 *)(plVar5 + 0xb8) = *(undefined8 *)(plVar5 + 0x18);
    *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
    *(code **)(plVar5 + 200) = finish;
    e = (ect *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_2c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
    operator_delete(local_2c8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if (e != (ect *)0x0) {
    free(e);
  }
  return (base_learner *)plVar5;
}

Assistant:

base_learner* ect_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<ect>();
  std::string link;
  option_group_definition new_options("Error Correcting Tournament Options");
  new_options.add(make_option("ect", data->k).keep().help("Error correcting tournament with <k> labels"))
      .add(make_option("error", data->errors).keep().default_value(0).help("errors allowed by ECT"))
      // Used to check value. TODO replace
      .add(make_option("link", link)
               .default_value("identity")
               .keep()
               .help("Specify the link function: identity, logistic, glf1 or poisson"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("ect"))
    return nullptr;

  size_t wpp = create_circuit(*data.get(), data->k, data->errors + 1);

  base_learner* base = setup_base(options, all);
  if (link.compare("logistic") == 0)
    data->class_boundary = 0.5;  // as --link=logistic maps predictions in [0;1]

  learner<ect, example>& l = init_multiclass_learner(data, as_singleline(base), learn, predict, all.p, wpp);
  l.set_finish(finish);

  return make_base(l);
}